

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_4::(anonymous_namespace)::ApplyS<Ptex::v2_4::PtexHalf,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ushort *puVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int local_4c;
  
  iVar7 = k->v1;
  if (iVar7 != k->v2) {
    fVar1 = k->A;
    local_4c = -iVar7;
    do {
      iVar4 = k->rowlen;
      iVar5 = k->u1;
      iVar10 = (iVar4 - iVar7) - k->w2;
      if (iVar10 < iVar5) {
        iVar10 = iVar5;
      }
      iVar9 = (iVar4 - iVar7) - k->w1;
      if (k->u2 < iVar9) {
        iVar9 = k->u2;
      }
      iVar9 = (iVar9 - iVar10) * nTxChan;
      if (0 < iVar9) {
        fVar13 = (float)iVar10 - k->u;
        fVar12 = (float)iVar7 - k->v;
        fVar14 = fVar13 * k->A * fVar13 + (k->B * fVar13 + k->C * fVar12) * fVar12;
        fVar12 = (fVar13 + fVar13 + 1.0) * k->A + fVar12 * k->B;
        iVar6 = (iVar4 + local_4c) - k->w2;
        if (iVar6 < iVar5) {
          iVar6 = iVar5;
        }
        puVar8 = (ushort *)((long)data + (long)((iVar6 + iVar4 * iVar7) * nTxChan) * 2);
        do {
          if (fVar14 < 1.0) {
            fVar11 = expf(fVar14 * -6.125);
            fVar11 = fVar11 * k->wscale;
            k->weight = k->weight + fVar11;
            fVar13 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[3] * 4);
            fVar2 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[2] * 4);
            fVar3 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[1] * 4);
            *result = fVar11 * *(float *)(PtexHalf::h2fTable + (ulong)*puVar8 * 4) + *result;
            result[1] = fVar11 * fVar3 + result[1];
            result[2] = fVar11 * fVar2 + result[2];
            result[3] = fVar11 * fVar13 + result[3];
          }
          fVar14 = fVar14 + fVar12;
          fVar12 = fVar12 + fVar1 + fVar1;
          puVar8 = puVar8 + nTxChan;
        } while (puVar8 < (ushort *)
                          ((long)data +
                          (long)iVar9 * 2 + (long)((iVar10 + iVar4 * iVar7) * nTxChan) * 2));
      }
      iVar7 = iVar7 + 1;
      local_4c = local_4c + -1;
    } while (iVar7 != k->v2);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }